

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMap.cpp
# Opt level: O2

Var Js::JavascriptMap::EntryForEach(RecyclableObject *function,CallInfo callInfo,...)

{
  Type *this;
  ScriptContext *pSVar1;
  ThreadContext *this_00;
  code *pcVar2;
  Type ppvVar3;
  Type ppvVar4;
  bool bVar5;
  undefined4 *puVar6;
  Var pvVar7;
  JavascriptMap *pJVar8;
  RecyclableObject *pRVar9;
  JavascriptMethod p_Var10;
  int in_stack_00000010;
  undefined1 local_a8 [8];
  AutoTagNativeLibraryEntry __tag;
  CallInfo callInfo_local;
  Iterator iterator;
  ArgumentReader args;
  RecyclableObject *local_50;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  __tag.entry.next = (Entry *)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptMap.cpp"
                                ,0x9a,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar5) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&iterator.current,(CallInfo *)&__tag.entry.next,
             (Var *)&stack0x00000018);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry
            ((AutoTagNativeLibraryEntry *)local_a8,function,(CallInfo)__tag.entry.next,
             L"Map.prototype.forEach",&stack0x00000000);
  pvVar7 = Arguments::operator[]((Arguments *)&iterator.current,0);
  bVar5 = VarIs<Js::JavascriptMap>(pvVar7);
  if (bVar5) {
    pJVar8 = UnsafeVarTo<Js::JavascriptMap>(pvVar7);
    if (pJVar8 != (JavascriptMap *)0x0) {
      if (((uint)iterator.current.ptr & 0xfffffe) != 0) {
        pvVar7 = Arguments::operator[]((Arguments *)&iterator.current,1);
        bVar5 = JavascriptConversion::IsCallable(pvVar7);
        if (bVar5) {
          pvVar7 = Arguments::operator[]((Arguments *)&iterator.current,1);
          pRVar9 = VarTo<Js::RecyclableObject>(pvVar7);
          if (((uint)iterator.current.ptr & 0xffffff) < 3) {
            local_50 = (((pSVar1->super_ScriptContextBase).javascriptLibrary)->
                       super_JavascriptLibraryBase).undefinedValue.ptr;
          }
          else {
            local_50 = (RecyclableObject *)Arguments::operator[]((Arguments *)&iterator.current,2);
          }
          MapOrSetDataList<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
          ::Iterator::Iterator((Iterator *)&callInfo_local,&pJVar8->list);
          this = &args.super_Arguments.Values;
          while( true ) {
            bVar5 = MapOrSetDataList<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
                    ::Iterator::Next((Iterator *)&callInfo_local);
            if (!bVar5) break;
            JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>::Key
                      ((KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>
                        *)this);
            ppvVar3 = args.super_Arguments.Values;
            JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>::
            Value((KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_> *)
                  this);
            ppvVar4 = args.super_Arguments.Values;
            this_00 = pSVar1->threadContext;
            bVar5 = this_00->reentrancySafeOrHandled;
            this_00->reentrancySafeOrHandled = true;
            ThreadContext::CheckAndResetReentrancySafeOrHandled(this_00);
            ThreadContext::AssertJsReentrancy(pSVar1->threadContext);
            p_Var10 = RecyclableObject::GetEntryPoint(pRVar9);
            CheckIsExecutable(pRVar9,p_Var10);
            p_Var10 = RecyclableObject::GetEntryPoint(pRVar9);
            (*p_Var10)(pRVar9,(CallInfo)pRVar9,0x2000004,0,0,0,0,0x2000004,local_50,ppvVar4,ppvVar3,
                       pJVar8);
            this_00->reentrancySafeOrHandled = bVar5;
          }
          pRVar9 = (((pSVar1->super_ScriptContextBase).javascriptLibrary)->
                   super_JavascriptLibraryBase).undefinedValue.ptr;
          AutoTagNativeLibraryEntry::~AutoTagNativeLibraryEntry
                    ((AutoTagNativeLibraryEntry *)local_a8);
          return pRVar9;
        }
      }
      JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec34,L"Map.prototype.forEach");
    }
  }
  JavascriptError::ThrowTypeErrorVar(pSVar1,-0x7ff5ec04,L"Map.prototype.forEach",L"Map");
}

Assistant:

Var JavascriptMap::EntryForEach(RecyclableObject* function, CallInfo callInfo, ...)
{
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

    ARGUMENTS(args, callInfo);
    ScriptContext* scriptContext = function->GetScriptContext();
    AUTO_TAG_NATIVE_LIBRARY_ENTRY(function, callInfo, _u("Map.prototype.forEach"));

    JavascriptMap* map = JavascriptOperators::TryFromVar<JavascriptMap>(args[0]);
    if (map == nullptr)
    {
        JavascriptError::ThrowTypeErrorVar(scriptContext, JSERR_NeedObjectOfType, _u("Map.prototype.forEach"), _u("Map"));
    }

    if (args.Info.Count < 2 || !JavascriptConversion::IsCallable(args[1]))
    {
        JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("Map.prototype.forEach"));
    }
    RecyclableObject* callBackFn = VarTo<RecyclableObject>(args[1]);

    Var thisArg = (args.Info.Count > 2) ? args[2] : scriptContext->GetLibrary()->GetUndefined();

    auto iterator = map->GetIterator();

    while (iterator.Next())
    {
        Var key = iterator.Current().Key();
        Var value = iterator.Current().Value();

        BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
        {
            CALL_FUNCTION(scriptContext->GetThreadContext(), callBackFn, CallInfo(CallFlags_Value, 4), thisArg, value, key, map);
        }
        END_SAFE_REENTRANT_CALL
    }

    return scriptContext->GetLibrary()->GetUndefined();
}